

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.hpp
# Opt level: O0

__sighandler_t __thiscall
wigwag::signal<void_()>::~signal(signal<void_()> *this,int __sig,__sighandler_t __handler)

{
  bool bVar1;
  signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
  *psVar2;
  lock_primitive *this_00;
  __sighandler_t extraout_RAX;
  anon_class_8_1_8991fb9c_for__f local_28;
  undefined1 local_20 [8];
  scope_guard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_koplyarov[P]wigwag_include_wigwag_signal_hpp:104:49)>
  sg;
  signal<void_()> *this_local;
  
  sg._8_8_ = this;
  bVar1 = wigwag::detail::creation_storage_adapter::operator_cast_to_bool
                    ((creation_storage_adapter *)this);
  if (bVar1) {
    psVar2 = wigwag::detail::
             creation_storage_adapter<wigwag::creation::ahead_of_time::storage<wigwag::detail::intrusive_ptr<wigwag::detail::signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>,_wigwag::detail::signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>_>
             ::operator->(&this->_impl);
    this_00 = wigwag::detail::
              signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
              ::get_lock_primitive(psVar2);
    threading::own_recursive_mutex::lock_primitive::lock_nonrecursive(this_00);
    local_28.this = this;
    wigwag::detail::at_scope_exit<wigwag::signal<void()>::~signal()::_lambda()_1_>
              ((detail *)local_20,&local_28);
    psVar2 = wigwag::detail::
             creation_storage_adapter<wigwag::creation::ahead_of_time::storage<wigwag::detail::intrusive_ptr<wigwag::detail::signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>,_wigwag::detail::signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>_>
             ::operator->(&this->_impl);
    wigwag::detail::
    signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
    ::finalize_nodes(psVar2);
    wigwag::detail::
    scope_guard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/koplyarov[P]wigwag/include/wigwag/signal.hpp:104:49)>
    ::~scope_guard((scope_guard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_koplyarov[P]wigwag_include_wigwag_signal_hpp:104:49)>
                    *)local_20);
  }
  wigwag::detail::
  creation_storage_adapter<wigwag::creation::ahead_of_time::storage<wigwag::detail::intrusive_ptr<wigwag::detail::signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>,_wigwag::detail::signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>_>
  ::~creation_storage_adapter(&this->_impl);
  return extraout_RAX;
}

Assistant:

~signal()
        {
            if (_impl)
            {
                _impl->get_lock_primitive().lock_nonrecursive();
                auto sg = detail::at_scope_exit([&] { _impl->get_lock_primitive().unlock_nonrecursive(); } );

                _impl->finalize_nodes();
            }
        }